

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_copy.cpp
# Opt level: O2

void duckdb::VectorOperations::Copy
               (Vector *source_p,Vector *target,SelectionVector *sel_p,idx_t source_count,
               idx_t source_offset,idx_t target_offset,idx_t copy_count)

{
  VectorType vector_type_p;
  VectorType VVar1;
  PhysicalType PVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  long lVar6;
  undefined8 uVar7;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  bool bVar10;
  SelectionVector *sel;
  Vector *pVVar11;
  SelectionVector *sel_00;
  ValidityMask *this;
  Vector *target_00;
  idx_t iVar12;
  long lVar13;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  const_reference this_02;
  type source_p_00;
  reference this_03;
  type target_01;
  NotImplementedException *pNVar14;
  InternalException *this_04;
  PhysicalType type;
  idx_t iVar15;
  data_ptr_t pdVar16;
  ulong uVar17;
  idx_t iVar18;
  idx_t j;
  ulong uVar19;
  long lVar20;
  idx_t i;
  data_t *pdVar21;
  long *plVar22;
  string_t sVar23;
  ulong local_168;
  data_t *local_160;
  int64_t start;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  data_ptr_t local_118;
  Vector *local_110;
  buffer_ptr<SelectionData> new_buffer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [6];
  int64_t increment;
  __shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> local_90;
  LogicalType local_80;
  SelectionVector owned_sel;
  string local_50;
  
  owned_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  owned_sel.sel_vector = (sel_t *)0x0;
  owned_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  sel = sel_p;
LAB_01332014:
  bVar10 = false;
  do {
    if (bVar10) {
switchD_01332036_caseD_0:
      if (copy_count != 0) {
        vector_type_p = target->vector_type;
        local_160 = (data_t *)target_offset;
        if (vector_type_p == CONSTANT_VECTOR && copy_count == 1) {
          local_160 = (data_t *)0x0;
          Vector::SetVectorType(target,FLAT_VECTOR);
        }
        FlatVector::VerifyFlatVector(target);
        this = &target->validity;
        VVar1 = source_p->vector_type;
        if (VVar1 == FLAT_VECTOR) {
          FlatVector::VerifyFlatVector(source_p);
LAB_013321d9:
          ValidityMask::CopySel
                    (this,&source_p->validity,sel,source_offset,(idx_t)local_160,copy_count);
        }
        else {
          if (VVar1 == FSST_VECTOR) goto LAB_013321d9;
          if (VVar1 != CONSTANT_VECTOR) {
            this_04 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&new_buffer,"Unsupported vector type in vector copy",
                       (allocator *)&start);
            InternalException::InternalException(this_04,(string *)&new_buffer);
            __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          puVar3 = (source_p->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          iVar12 = copy_count;
          pdVar21 = local_160;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar10 = true;
          }
          else {
            bVar10 = (bool)((byte)*puVar3 & 1);
          }
          while (iVar12 != 0) {
            TemplatedValidityMask<unsigned_long>::Set
                      (&this->super_TemplatedValidityMask<unsigned_long>,(idx_t)pdVar21,bVar10);
            iVar12 = iVar12 - 1;
            pdVar21 = (data_t *)((long)pdVar21 + 1);
          }
        }
        if (source_p->vector_type == FSST_VECTOR) {
          FSSTVector::DecompressVector
                    (source_p,target,source_offset,(idx_t)local_160,copy_count,sel);
          goto LAB_01332a07;
        }
        PVar2 = (source_p->type).physical_type_;
        local_168 = source_offset;
        switch(PVar2) {
        case BOOL:
        case INT8:
          pdVar4 = source_p->data;
          local_160 = target->data + (long)local_160;
          while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
            uVar17 = local_168;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar17 = (ulong)sel->sel_vector[local_168];
            }
            *local_160 = pdVar4[uVar17];
            local_160 = local_160 + 1;
            local_168 = local_168 + 1;
          }
          break;
        case UINT8:
          pdVar4 = source_p->data;
          local_160 = target->data + (long)local_160;
          while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
            uVar17 = local_168;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar17 = (ulong)sel->sel_vector[local_168];
            }
            *local_160 = pdVar4[uVar17];
            local_160 = local_160 + 1;
            local_168 = local_168 + 1;
          }
          break;
        case UINT16:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined2 *)(pdVar4 + iVar12 * 2 + (long)local_160 * 2) =
                 *(undefined2 *)(pdVar16 + uVar17 * 2);
          }
          break;
        case INT16:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined2 *)(pdVar4 + iVar12 * 2 + (long)local_160 * 2) =
                 *(undefined2 *)(pdVar16 + uVar17 * 2);
          }
          break;
        case UINT32:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined4 *)(pdVar4 + iVar12 * 4 + (long)local_160 * 4) =
                 *(undefined4 *)(pdVar16 + uVar17 * 4);
          }
          break;
        case INT32:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined4 *)(pdVar4 + iVar12 * 4 + (long)local_160 * 4) =
                 *(undefined4 *)(pdVar16 + uVar17 * 4);
          }
          break;
        case UINT64:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined8 *)(pdVar4 + iVar12 * 8 + (long)local_160 * 8) =
                 *(undefined8 *)(pdVar16 + uVar17 * 8);
          }
          break;
        case INT64:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined8 *)(pdVar4 + iVar12 * 8 + (long)local_160 * 8) =
                 *(undefined8 *)(pdVar16 + uVar17 * 8);
          }
          break;
        case UINT64|UINT8:
        case DOUBLE|BOOL:
        case DOUBLE|UINT8:
        case DOUBLE|INT8:
        case 0x10:
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x16:
        case STRUCT|BOOL:
        case STRUCT|UINT8:
        case STRUCT|INT8:
        case STRUCT|UINT16:
switchD_0133223d_caseD_a:
          pNVar14 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&new_buffer,"Unimplemented type \'%s\' for copy!",(allocator *)&start
                    );
          TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)(source_p->type).physical_type_,type)
          ;
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (pNVar14,(string *)&new_buffer,&local_50);
          __cxa_throw(pNVar14,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        case FLOAT:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined4 *)(pdVar4 + iVar12 * 4 + (long)local_160 * 4) =
                 *(undefined4 *)(pdVar16 + uVar17 * 4);
          }
          break;
        case DOUBLE:
          pdVar4 = target->data;
          pdVar16 = source_p->data;
          psVar5 = sel->sel_vector;
          for (iVar12 = 0; copy_count != iVar12; iVar12 = iVar12 + 1) {
            if (psVar5 == (sel_t *)0x0) {
              uVar17 = source_offset + iVar12;
            }
            else {
              uVar17 = (ulong)psVar5[source_offset + iVar12];
            }
            *(undefined8 *)(pdVar4 + iVar12 * 8 + (long)local_160 * 8) =
                 *(undefined8 *)(pdVar16 + uVar17 * 8);
          }
          break;
        case INTERVAL:
          pdVar4 = source_p->data;
          pdVar16 = target->data + (long)local_160 * 0x10;
          while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
            uVar17 = local_168;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar17 = (ulong)sel->sel_vector[local_168];
            }
            uVar7 = *(undefined8 *)(pdVar4 + uVar17 * 0x10 + 8);
            *(undefined8 *)pdVar16 = *(undefined8 *)(pdVar4 + uVar17 * 0x10);
            *(undefined8 *)(pdVar16 + 8) = uVar7;
            pdVar16 = pdVar16 + 0x10;
            local_168 = local_168 + 1;
          }
          break;
        case LIST:
          local_110 = ListVector::GetEntry(source_p);
          pdVar4 = source_p->data;
          local_118 = target->data;
          if (vector_type_p != CONSTANT_VECTOR) {
            local_f8[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            new_buffer.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            new_buffer.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            for (iVar12 = 0;
                _Var9._M_pi = new_buffer.internal.
                              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,
                peVar8 = new_buffer.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr, iVar12 != copy_count; iVar12 = iVar12 + 1) {
              bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&this->super_TemplatedValidityMask<unsigned_long>,
                                  iVar12 + (long)local_160);
              if (bVar10) {
                uVar17 = iVar12 + source_offset;
                if (sel->sel_vector != (sel_t *)0x0) {
                  uVar17 = (ulong)sel->sel_vector[uVar17];
                }
                for (uVar19 = 0; uVar19 < *(ulong *)((long)(pdVar4 + uVar17 * 0x10) + 8);
                    uVar19 = uVar19 + 1) {
                  start = *(long *)(pdVar4 + uVar17 * 0x10) + uVar19;
                  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  emplace_back<unsigned_long>
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_buffer,
                             (unsigned_long *)&start);
                }
              }
            }
            SelectionVector::SelectionVector
                      ((SelectionVector *)&start,
                       (sel_t *)new_buffer.internal.
                                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            iVar12 = ListVector::GetListSize(target);
            ListVector::Append(target,local_110,(SelectionVector *)&start,
                               (long)_Var9._M_pi - (long)peVar8 >> 2,0);
            plVar22 = (long *)(local_118 + (long)local_160 * 0x10 + 8);
            while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
              uVar17 = local_168;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar17 = (ulong)sel->sel_vector[local_168];
              }
              *plVar22 = *(long *)(pdVar4 + uVar17 * 0x10 + 8);
              plVar22[-1] = iVar12;
              bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&this->super_TemplatedValidityMask<unsigned_long>,(idx_t)local_160
                                 );
              if (bVar10) {
                iVar12 = iVar12 + *plVar22;
              }
              local_168 = local_168 + 1;
              local_160 = (data_t *)((long)local_160 + 1);
              plVar22 = plVar22 + 2;
            }
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
            ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&new_buffer);
            break;
          }
          bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&this->super_TemplatedValidityMask<unsigned_long>,(idx_t)local_160);
          if (bVar10) {
            if (sel->sel_vector != (sel_t *)0x0) {
              source_offset = (idx_t)sel->sel_vector[source_offset];
            }
            lVar20 = source_offset * 0x10;
            lVar13 = *(long *)(pdVar4 + lVar20);
            lVar6 = *(long *)(pdVar4 + lVar20 + 8);
            ListVector::SetListSize(target,0);
            ListVector::Append(target,local_110,lVar13 + lVar6,*(idx_t *)(pdVar4 + lVar20));
            *(idx_t *)(local_118 + (long)local_160 * 0x10 + 8) =
                 *(idx_t *)((long)(pdVar4 + lVar20) + 8);
            pdVar4 = local_118 + (long)local_160 * 0x10;
            pdVar4[0] = '\0';
            pdVar4[1] = '\0';
            pdVar4[2] = '\0';
            pdVar4[3] = '\0';
            pdVar4[4] = '\0';
            pdVar4[5] = '\0';
            pdVar4[6] = '\0';
            pdVar4[7] = '\0';
          }
          goto LAB_013329f8;
        case STRUCT:
          this_00 = StructVector::GetEntries(source_p);
          this_01 = StructVector::GetEntries(target);
          for (uVar17 = 0;
              uVar17 < (ulong)((long)(this_00->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->
                                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ).
                                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar17 = uVar17 + 1) {
            this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_00,uVar17);
            source_p_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                          operator*(this_02);
            this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_01,uVar17);
            target_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(this_03);
            Copy(source_p_00,target_01,sel_p,source_count,source_offset,(idx_t)local_160,copy_count)
            ;
          }
          break;
        case ARRAY:
          pVVar11 = ArrayVector::GetEntry(source_p);
          target_00 = ArrayVector::GetEntry(target);
          iVar12 = ArrayType::GetSize(&source_p->type);
          SelectionVector::SelectionVector((SelectionVector *)&new_buffer,source_count * iVar12);
          lVar13 = iVar12 * source_offset * 4;
          for (iVar15 = 0; iVar15 != copy_count; iVar15 = iVar15 + 1) {
            uVar17 = source_offset + iVar15;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar17 = (ulong)sel->sel_vector[uVar17];
            }
            for (iVar18 = 0; iVar12 != iVar18; iVar18 = iVar18 + 1) {
              *(int *)((long)&((new_buffer.internal.
                                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->owned_data).allocator.ptr + iVar18 * 4 + lVar13) =
                   (int)uVar17 * (int)iVar12 + (int)iVar18;
            }
            lVar13 = lVar13 + iVar12 * 4;
          }
          Copy(pVVar11,target_00,(SelectionVector *)&new_buffer,source_count * iVar12,
               iVar12 * source_offset,iVar12 * (long)local_160);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_f8[0]._M_allocated_capacity);
          break;
        default:
          if (PVar2 == VARCHAR) {
            pdVar4 = source_p->data;
            pdVar16 = target->data + (long)local_160 * 0x10 + 8;
            while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
              uVar17 = local_168;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar17 = (ulong)sel->sel_vector[local_168];
              }
              uVar19 = local_168;
              bVar10 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&this->super_TemplatedValidityMask<unsigned_long>,(idx_t)local_160
                                 );
              if (bVar10) {
                sVar23.value.pointer.ptr = (char *)uVar19;
                sVar23.value._0_8_ = *(undefined8 *)(pdVar4 + uVar17 * 0x10 + 8);
                sVar23 = StringVector::AddStringOrBlob
                                   ((StringVector *)target,*(Vector **)(pdVar4 + uVar17 * 0x10),
                                    sVar23);
                *(long *)(pdVar16 + -8) = sVar23.value._0_8_;
                *(long *)pdVar16 = sVar23.value._8_8_;
              }
              local_168 = local_168 + 1;
              local_160 = (data_t *)((long)local_160 + 1);
              pdVar16 = pdVar16 + 0x10;
            }
          }
          else if (PVar2 == UINT128) {
            pdVar4 = source_p->data;
            pdVar16 = target->data + (long)local_160 * 0x10;
            while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
              uVar17 = local_168;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar17 = (ulong)sel->sel_vector[local_168];
              }
              uVar7 = *(undefined8 *)(pdVar4 + uVar17 * 0x10 + 8);
              *(undefined8 *)pdVar16 = *(undefined8 *)(pdVar4 + uVar17 * 0x10);
              *(undefined8 *)(pdVar16 + 8) = uVar7;
              pdVar16 = pdVar16 + 0x10;
              local_168 = local_168 + 1;
            }
          }
          else {
            if (PVar2 != INT128) goto switchD_0133223d_caseD_a;
            pdVar4 = source_p->data;
            pdVar16 = target->data + (long)local_160 * 0x10;
            while (bVar10 = copy_count != 0, copy_count = copy_count - 1, bVar10) {
              uVar17 = local_168;
              if (sel->sel_vector != (sel_t *)0x0) {
                uVar17 = (ulong)sel->sel_vector[local_168];
              }
              uVar7 = *(undefined8 *)(pdVar4 + uVar17 * 0x10 + 8);
              *(undefined8 *)pdVar16 = *(undefined8 *)(pdVar4 + uVar17 * 0x10);
              *(undefined8 *)(pdVar16 + 8) = uVar7;
              pdVar16 = pdVar16 + 0x10;
              local_168 = local_168 + 1;
            }
          }
        }
        if (vector_type_p != FLAT_VECTOR) {
LAB_013329f8:
          Vector::SetVectorType(target,vector_type_p);
        }
      }
      goto LAB_01332a07;
    }
    switch(source_p->vector_type) {
    case FLAT_VECTOR:
    case FSST_VECTOR:
      goto switchD_01332036_caseD_0;
    case CONSTANT_VECTOR:
      bVar10 = true;
      sel = ConstantVector::ZeroSelectionVector(copy_count,&owned_sel);
      break;
    case DICTIONARY_VECTOR:
      goto switchD_01332036_caseD_3;
    case SEQUENCE_VECTOR:
      LogicalType::LogicalType(&local_80,&source_p->type);
      Vector::Vector((Vector *)&new_buffer,&local_80,0x800);
      LogicalType::~LogicalType(&local_80);
      SequenceVector::GetSequence(source_p,&start,&increment);
      GenerateSequence((Vector *)&new_buffer,source_count,sel,start,increment);
      Copy((Vector *)&new_buffer,target,sel,source_count,source_offset,target_offset);
      Vector::~Vector((Vector *)&new_buffer);
LAB_01332a07:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&owned_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      return;
    default:
      pNVar14 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&new_buffer,"FIXME unimplemented vector type for VectorOperations::Copy",
                 (allocator *)&start);
      NotImplementedException::NotImplementedException(pNVar14,(string *)&new_buffer);
      __cxa_throw(pNVar14,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  } while( true );
switchD_01332036_caseD_3:
  pVVar11 = DictionaryVector::Child(source_p);
  sel_00 = DictionaryVector::SelVector(source_p);
  SelectionVector::Slice((SelectionVector *)&new_buffer,sel_00,(idx_t)sel);
  ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)&new_buffer);
  SelectionVector::Initialize(&owned_sel,(buffer_ptr<SelectionData> *)&local_90);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_buffer.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  source_p = pVVar11;
  sel = &owned_sel;
  goto LAB_01332014;
}

Assistant:

void VectorOperations::Copy(const Vector &source_p, Vector &target, const SelectionVector &sel_p, idx_t source_count,
                            idx_t source_offset, idx_t target_offset, idx_t copy_count) {

	SelectionVector owned_sel;
	const SelectionVector *sel = &sel_p;

	const Vector *source = &source_p;
	bool finished = false;
	while (!finished) {
		switch (source->GetVectorType()) {
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector: merge selection vectors
			auto &child = DictionaryVector::Child(*source);
			auto &dict_sel = DictionaryVector::SelVector(*source);
			// merge the selection vectors and verify the child
			auto new_buffer = dict_sel.Slice(*sel, source_count);
			owned_sel.Initialize(new_buffer);
			sel = &owned_sel;
			source = &child;
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			int64_t start, increment;
			Vector seq(source->GetType());
			SequenceVector::GetSequence(*source, start, increment);
			VectorOperations::GenerateSequence(seq, source_count, *sel, start, increment);
			VectorOperations::Copy(seq, target, *sel, source_count, source_offset, target_offset);
			return;
		}
		case VectorType::CONSTANT_VECTOR:
			sel = ConstantVector::ZeroSelectionVector(copy_count, owned_sel);
			finished = true;
			break;
		case VectorType::FSST_VECTOR:
			finished = true;
			break;
		case VectorType::FLAT_VECTOR:
			finished = true;
			break;
		default:
			throw NotImplementedException("FIXME unimplemented vector type for VectorOperations::Copy");
		}
	}

	if (copy_count == 0) {
		return;
	}

	// Allow copying of a single value to constant vectors
	const auto target_vector_type = target.GetVectorType();
	if (copy_count == 1 && target_vector_type == VectorType::CONSTANT_VECTOR) {
		target_offset = 0;
		target.SetVectorType(VectorType::FLAT_VECTOR);
	}
	D_ASSERT(target.GetVectorType() == VectorType::FLAT_VECTOR);

	// first copy the nullmask
	auto &tmask = FlatVector::Validity(target);
	if (source->GetVectorType() == VectorType::CONSTANT_VECTOR) {
		const bool valid = !ConstantVector::IsNull(*source);
		for (idx_t i = 0; i < copy_count; i++) {
			tmask.Set(target_offset + i, valid);
		}
	} else {
		auto &smask = ExtractValidityMask(*source);
		tmask.CopySel(smask, *sel, source_offset, target_offset, copy_count);
	}

	D_ASSERT(sel);

	// For FSST Vectors we decompress instead of copying.
	if (source->GetVectorType() == VectorType::FSST_VECTOR) {
		FSSTVector::DecompressVector(*source, target, source_offset, target_offset, copy_count, sel);
		return;
	}

	// now copy over the data
	switch (source->GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedCopy<int8_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT16:
		TemplatedCopy<int16_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT32:
		TemplatedCopy<int32_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT64:
		TemplatedCopy<int64_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT8:
		TemplatedCopy<uint8_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT16:
		TemplatedCopy<uint16_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT32:
		TemplatedCopy<uint32_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT64:
		TemplatedCopy<uint64_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INT128:
		TemplatedCopy<hugeint_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::UINT128:
		TemplatedCopy<uhugeint_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::FLOAT:
		TemplatedCopy<float>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedCopy<double>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedCopy<interval_t>(*source, *sel, target, source_offset, target_offset, copy_count);
		break;
	case PhysicalType::VARCHAR: {
		auto ldata = FlatVector::GetData<string_t>(*source);
		auto tdata = FlatVector::GetData<string_t>(target);
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = sel->get_index(source_offset + i);
			auto target_idx = target_offset + i;
			if (tmask.RowIsValid(target_idx)) {
				tdata[target_idx] = StringVector::AddStringOrBlob(target, ldata[source_idx]);
			}
		}
		break;
	}
	case PhysicalType::STRUCT: {
		auto &source_children = StructVector::GetEntries(*source);
		auto &target_children = StructVector::GetEntries(target);
		D_ASSERT(source_children.size() == target_children.size());
		for (idx_t i = 0; i < source_children.size(); i++) {
			VectorOperations::Copy(*source_children[i], *target_children[i], sel_p, source_count, source_offset,
			                       target_offset, copy_count);
		}
		break;
	}
	case PhysicalType::ARRAY: {
		D_ASSERT(target.GetType().InternalType() == PhysicalType::ARRAY);
		D_ASSERT(ArrayType::GetSize(source->GetType()) == ArrayType::GetSize(target.GetType()));

		auto &source_child = ArrayVector::GetEntry(*source);
		auto &target_child = ArrayVector::GetEntry(target);
		auto array_size = ArrayType::GetSize(source->GetType());

		// Create a selection vector for the child elements
		SelectionVector child_sel(source_count * array_size);
		for (idx_t i = 0; i < copy_count; i++) {
			auto source_idx = sel->get_index(source_offset + i);
			for (idx_t j = 0; j < array_size; j++) {
				child_sel.set_index((source_offset * array_size) + (i * array_size + j), source_idx * array_size + j);
			}
		}
		VectorOperations::Copy(source_child, target_child, child_sel, source_count * array_size,
		                       source_offset * array_size, target_offset * array_size);
		break;
	}
	case PhysicalType::LIST: {
		D_ASSERT(target.GetType().InternalType() == PhysicalType::LIST);

		auto &source_child = ListVector::GetEntry(*source);
		auto sdata = FlatVector::GetData<list_entry_t>(*source);
		auto tdata = FlatVector::GetData<list_entry_t>(target);

		if (target_vector_type == VectorType::CONSTANT_VECTOR) {
			// If we are only writing one value, then the copied values (if any) are contiguous
			// and we can just Append from the offset position
			if (!tmask.RowIsValid(target_offset)) {
				break;
			}
			auto source_idx = sel->get_index(source_offset);
			auto &source_entry = sdata[source_idx];
			const idx_t source_child_size = source_entry.length + source_entry.offset;

			//! overwrite constant target vectors.
			ListVector::SetListSize(target, 0);
			ListVector::Append(target, source_child, source_child_size, source_entry.offset);

			auto &target_entry = tdata[target_offset];
			target_entry.length = source_entry.length;
			target_entry.offset = 0;
		} else {
			//! if the source has list offsets, we need to append them to the target
			//! build a selection vector for the copied child elements
			vector<sel_t> child_rows;
			for (idx_t i = 0; i < copy_count; ++i) {
				if (tmask.RowIsValid(target_offset + i)) {
					auto source_idx = sel->get_index(source_offset + i);
					auto &source_entry = sdata[source_idx];
					for (idx_t j = 0; j < source_entry.length; ++j) {
						child_rows.emplace_back(source_entry.offset + j);
					}
				}
			}
			idx_t source_child_size = child_rows.size();
			SelectionVector child_sel(child_rows.data());

			idx_t old_target_child_len = ListVector::GetListSize(target);

			//! append to list itself
			ListVector::Append(target, source_child, child_sel, source_child_size);

			//! now write the list offsets
			for (idx_t i = 0; i < copy_count; i++) {
				auto source_idx = sel->get_index(source_offset + i);
				auto &source_entry = sdata[source_idx];
				auto &target_entry = tdata[target_offset + i];

				target_entry.length = source_entry.length;
				target_entry.offset = old_target_child_len;
				if (tmask.RowIsValid(target_offset + i)) {
					old_target_child_len += target_entry.length;
				}
			}
		}
		break;
	}
	default:
		throw NotImplementedException("Unimplemented type '%s' for copy!",
		                              TypeIdToString(source->GetType().InternalType()));
	}

	if (target_vector_type != VectorType::FLAT_VECTOR) {
		target.SetVectorType(target_vector_type);
	}
}